

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char * fmt::v8::detail::
       parse_align<char,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>_>
                 *handler)

{
  char cVar1;
  basic_format_specs<char> *pbVar2;
  ulong uVar3;
  char *pcVar4;
  align_t align;
  ulong uVar5;
  bool bVar6;
  
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/core.h"
                ,0x8fe,"");
  }
  pcVar4 = begin + (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                 [(byte)*begin >> 3] == 0) +
                   (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [(byte)*begin >> 3];
  if (end <= begin + (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                   [(byte)*begin >> 3] == 0) +
                     (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                           [(byte)*begin >> 3]) {
    pcVar4 = begin;
  }
  do {
    cVar1 = *pcVar4;
    if (cVar1 == '^') {
      align = center;
LAB_0011782a:
      bVar6 = false;
    }
    else {
      if (cVar1 == '>') {
        align = right;
        goto LAB_0011782a;
      }
      if (cVar1 == '<') {
        align = left;
        goto LAB_0011782a;
      }
      align = none;
      bVar6 = true;
    }
    if (!bVar6) {
      if (pcVar4 != begin) {
        if (*begin == 0x7b) {
          throw_format_error("invalid fill character \'{\'");
        }
        uVar3 = (long)pcVar4 - (long)begin;
        if ((long)uVar3 < 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/core.h"
                      ,0x1aa,"negative value");
        }
        if (4 < uVar3) {
          throw_format_error("invalid fill");
        }
        pbVar2 = (handler->
                 super_dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>
                 ).super_specs_setter<char>.specs_;
        if (pcVar4 != begin) {
          uVar5 = 0;
          do {
            (pbVar2->fill).data_[uVar5] = begin[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
        (pbVar2->fill).size_ = (uchar)uVar3;
        begin = pcVar4;
      }
      specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>_>
      ::on_align(handler,align);
      return begin + 1;
    }
    bVar6 = pcVar4 == begin;
    pcVar4 = begin;
    if (bVar6) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR auto parse_align(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = begin + code_point_length(begin);
  if (p >= end) p = begin;
  for (;;) {
    switch (to_ascii(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
    case '^':
      align = align::center;
      break;
    default:
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}